

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_fixture.c
# Opt level: O0

REF_STATUS
ref_fixture_pri_brick_args_grid
          (REF_GRID *ref_grid_ptr,REF_MPI ref_mpi,REF_DBL x0,REF_DBL x1,REF_DBL y0,REF_DBL y1,
          REF_DBL z0,REF_DBL z1,REF_INT l,REF_INT m,REF_INT n,REF_INT l0)

{
  REF_GRID pRVar1;
  REF_NODE ref_node_00;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int local_158;
  int local_154;
  REF_STATUS ref_private_macro_code_rss_15;
  REF_STATUS ref_private_macro_code_rss_14;
  REF_STATUS ref_private_macro_code_rss_13;
  REF_STATUS ref_private_macro_code_rss_12;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL dz;
  REF_DBL dy;
  REF_DBL dx;
  int local_f0;
  REF_INT k;
  REF_INT j;
  REF_INT i;
  REF_INT tri [4];
  REF_INT quad [5];
  REF_INT local_bc;
  int local_b8;
  REF_INT cell;
  REF_INT pri [6];
  REF_INT hex [8];
  REF_INT node;
  REF_INT global;
  REF_NODE ref_node;
  REF_GRID ref_grid;
  REF_INT l0_local;
  REF_INT n_local;
  REF_INT m_local;
  REF_INT l_local;
  REF_DBL z1_local;
  REF_DBL z0_local;
  REF_DBL y1_local;
  REF_DBL y0_local;
  REF_DBL x1_local;
  REF_DBL x0_local;
  REF_MPI ref_mpi_local;
  REF_GRID *ref_grid_ptr_local;
  
  local_154 = l0;
  if (l0 < 0) {
    local_154 = 0;
  }
  if (local_154 < l + -1) {
    local_158 = local_154;
  }
  else {
    local_158 = l + -1;
  }
  ref_grid_ptr_local._4_4_ = ref_grid_create(ref_grid_ptr,ref_mpi);
  if (ref_grid_ptr_local._4_4_ == 0) {
    pRVar1 = *ref_grid_ptr;
    ref_node_00 = pRVar1->node;
    if (pRVar1->mpi->id == 0) {
      for (dx._4_4_ = 0; dx._4_4_ < n; dx._4_4_ = dx._4_4_ + 1) {
        for (local_f0 = 0; local_f0 < m; local_f0 = local_f0 + 1) {
          for (k = 0; k < l; k = k + 1) {
            hex[7] = k + local_f0 * l + dx._4_4_ * l * m;
            uVar2 = ref_node_add(ref_node_00,(long)hex[7],hex + 6);
            if (uVar2 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                     ,0x5a6,"ref_fixture_pri_brick_args_grid",(ulong)uVar2,"node");
              return uVar2;
            }
            ref_node_00->real[hex[6] * 0xf] = ((x1 - x0) / (double)(l + -1)) * (double)k + x0;
            ref_node_00->real[hex[6] * 0xf + 1] =
                 ((y1 - y0) / (double)(m + -1)) * (double)local_f0 + y0;
            ref_node_00->real[hex[6] * 0xf + 2] =
                 ((z1 - z0) / (double)(n + -1)) * (double)dx._4_4_ + z0;
          }
        }
      }
      for (dx._4_4_ = 1; dx._4_4_ < n; dx._4_4_ = dx._4_4_ + 1) {
        for (local_f0 = 1; local_f0 < m; local_f0 = local_f0 + 1) {
          for (k = 1; k < l; k = k + 1) {
            iVar3 = k + -1 + (local_f0 + -1) * l + (dx._4_4_ + -1) * l * m;
            cell = k + (local_f0 + -1) * l + (dx._4_4_ + -1) * l * m;
            pri[0] = k + local_f0 * l + (dx._4_4_ + -1) * l * m;
            hex[1] = k + -1 + local_f0 * l + (dx._4_4_ + -1) * l * m;
            pri[1] = k + -1 + (local_f0 + -1) * l + dx._4_4_ * l * m;
            pri[2] = k + (local_f0 + -1) * l + dx._4_4_ * l * m;
            pri[3] = k + local_f0 * l + dx._4_4_ * l * m;
            hex[5] = k + -1 + local_f0 * l + dx._4_4_ * l * m;
            local_b8 = iVar3;
            hex[0] = pri[0];
            hex[2] = pri[1];
            hex[3] = pri[2];
            hex[4] = pri[3];
            uVar2 = ref_cell_add(pRVar1->cell[10],&local_b8,&local_bc);
            if (uVar2 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                     ,0x5c0,"ref_fixture_pri_brick_args_grid",(ulong)uVar2,"pri");
              return uVar2;
            }
            cell = hex[0];
            pri[0] = hex[1];
            pri[1] = hex[2];
            pri[2] = hex[4];
            pri[3] = hex[5];
            local_b8 = iVar3;
            uVar2 = ref_cell_add(pRVar1->cell[10],&local_b8,&local_bc);
            if (uVar2 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                     ,0x5c7,"ref_fixture_pri_brick_args_grid",(ulong)uVar2,"pri");
              return uVar2;
            }
          }
        }
      }
      for (dx._4_4_ = 1; dx._4_4_ < n; dx._4_4_ = dx._4_4_ + 1) {
        for (local_f0 = 1; local_f0 < m; local_f0 = local_f0 + 1) {
          tri[2] = (local_f0 + -1) * l + (dx._4_4_ + -1) * l * m;
          hex[0] = local_f0 * l + 1 + (dx._4_4_ + -1) * l * m;
          tri[3] = local_f0 * l + (dx._4_4_ + -1) * l * m;
          hex[2] = (local_f0 + -1) * l + dx._4_4_ * l * m;
          hex[3] = (local_f0 + -1) * l + 1 + dx._4_4_ * l * m;
          hex[4] = local_f0 * l + 1 + dx._4_4_ * l * m;
          hex[5] = local_f0 * l + dx._4_4_ * l * m;
          hex[1] = tri[3];
          uVar2 = ref_cell_add(pRVar1->cell[6],tri + 2,&local_bc);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                   ,0x5d3,"ref_fixture_pri_brick_args_grid",(ulong)uVar2,"qua");
            return uVar2;
          }
        }
      }
      iVar3 = l + -1;
      for (dx._4_4_ = 1; dx._4_4_ < n; dx._4_4_ = dx._4_4_ + 1) {
        for (local_f0 = 1; local_f0 < m; local_f0 = local_f0 + 1) {
          tri[3] = iVar3 + (local_f0 + -1) * l + (dx._4_4_ + -1) * l * m;
          tri[2] = iVar3 + local_f0 * l + (dx._4_4_ + -1) * l * m;
          hex[1] = l + -2 + local_f0 * l + (dx._4_4_ + -1) * l * m;
          hex[2] = l + -2 + (local_f0 + -1) * l + dx._4_4_ * l * m;
          hex[3] = iVar3 + (local_f0 + -1) * l + dx._4_4_ * l * m;
          hex[4] = iVar3 + local_f0 * l + dx._4_4_ * l * m;
          hex[5] = l + -2 + local_f0 * l + dx._4_4_ * l * m;
          hex[0] = tri[2];
          uVar2 = ref_cell_add(pRVar1->cell[6],tri + 2,&local_bc);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                   ,0x5df,"ref_fixture_pri_brick_args_grid",(ulong)uVar2,"qua");
            return uVar2;
          }
        }
      }
      for (dx._4_4_ = 1; dx._4_4_ < n; dx._4_4_ = dx._4_4_ + 1) {
        for (k = 1; k < l; k = k + 1) {
          tri[3] = k + -1 + (dx._4_4_ + -1) * l * m;
          tri[2] = k + (dx._4_4_ + -1) * l * m;
          hex[0] = k + l + (dx._4_4_ + -1) * l * m;
          hex[1] = k + -1 + l + (dx._4_4_ + -1) * l * m;
          hex[2] = k + -1 + dx._4_4_ * l * m;
          hex[3] = k + dx._4_4_ * l * m;
          hex[4] = k + l + dx._4_4_ * l * m;
          hex[5] = k + -1 + l + dx._4_4_ * l * m;
          uVar2 = ref_cell_add(pRVar1->cell[6],tri + 2,&local_bc);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                   ,0x5eb,"ref_fixture_pri_brick_args_grid",(ulong)uVar2,"qua");
            return uVar2;
          }
        }
      }
      iVar3 = m + -1;
      for (dx._4_4_ = 1; dx._4_4_ < n; dx._4_4_ = dx._4_4_ + 1) {
        for (k = 1; k < l; k = k + 1) {
          tri[3] = k + iVar3 * l + (dx._4_4_ + -1) * l * m;
          tri[2] = k + -1 + iVar3 * l + (dx._4_4_ + -1) * l * m;
          hex[2] = k + -1 + (m + -2) * l + dx._4_4_ * l * m;
          hex[3] = k + (m + -2) * l + dx._4_4_ * l * m;
          hex[4] = k + iVar3 * l + dx._4_4_ * l * m;
          hex[5] = k + -1 + iVar3 * l + dx._4_4_ * l * m;
          hex[0] = tri[3];
          hex[1] = tri[2];
          uVar2 = ref_cell_add(pRVar1->cell[6],tri + 2,&local_bc);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                   ,0x5f7,"ref_fixture_pri_brick_args_grid",(ulong)uVar2,"qua");
            return uVar2;
          }
        }
      }
      tri[1] = 7;
      for (local_f0 = 1; local_f0 < m; local_f0 = local_f0 + 1) {
        for (k = 1; k < local_158 + 1; k = k + 1) {
          j = k + -1 + (local_f0 + -1) * l;
          i = k + (local_f0 + -1) * l;
          iVar3 = k + local_f0 * l;
          iVar4 = k + -1 + local_f0 * l;
          hex[2] = k + -1 + (local_f0 + -1) * l + l * m;
          hex[3] = k + (local_f0 + -1) * l + l * m;
          hex[4] = k + local_f0 * l + l * m;
          hex[5] = k + -1 + local_f0 * l + l * m;
          tri[0] = iVar3;
          tri[2] = j;
          tri[3] = i;
          hex[0] = iVar3;
          hex[1] = iVar4;
          uVar2 = ref_cell_add(pRVar1->cell[3],&j,&local_bc);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                   ,0x607,"ref_fixture_pri_brick_args_grid",(ulong)uVar2,"tri");
            return uVar2;
          }
          j = tri[2];
          i = iVar3;
          tri[0] = iVar4;
          uVar2 = ref_cell_add(pRVar1->cell[3],&j,&local_bc);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                   ,0x60b,"ref_fixture_pri_brick_args_grid",(ulong)uVar2,"tri");
            return uVar2;
          }
        }
      }
      tri[1] = 5;
      for (local_f0 = 1; iVar3 = local_158, local_f0 < m; local_f0 = local_f0 + 1) {
        while (k = iVar3 + 1, k < l) {
          j = iVar3 + (local_f0 + -1) * l;
          i = k + (local_f0 + -1) * l;
          iVar4 = k + local_f0 * l;
          iVar5 = iVar3 + local_f0 * l;
          hex[2] = iVar3 + (local_f0 + -1) * l + l * m;
          hex[3] = k + (local_f0 + -1) * l + l * m;
          hex[4] = k + local_f0 * l + l * m;
          hex[5] = iVar3 + local_f0 * l + l * m;
          tri[0] = iVar4;
          tri[2] = j;
          tri[3] = i;
          hex[0] = iVar4;
          hex[1] = iVar5;
          uVar2 = ref_cell_add(pRVar1->cell[3],&j,&local_bc);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                   ,0x61b,"ref_fixture_pri_brick_args_grid",(ulong)uVar2,"tri");
            return uVar2;
          }
          j = tri[2];
          i = iVar4;
          tri[0] = iVar5;
          uVar2 = ref_cell_add(pRVar1->cell[3],&j,&local_bc);
          iVar3 = k;
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                   ,0x61f,"ref_fixture_pri_brick_args_grid",(ulong)uVar2,"tri");
            return uVar2;
          }
        }
      }
      tri[1] = 6;
      iVar3 = n + -1;
      for (local_f0 = 1; local_f0 < m; local_f0 = local_f0 + 1) {
        for (k = 1; k < l; k = k + 1) {
          hex[0] = k + local_f0 * l + (n + -2) * l * m;
          hex[1] = k + -1 + local_f0 * l + (n + -2) * l * m;
          j = k + -1 + (local_f0 + -1) * l + iVar3 * l * m;
          tri[0] = k + (local_f0 + -1) * l + iVar3 * l * m;
          iVar4 = k + local_f0 * l + iVar3 * l * m;
          iVar5 = k + -1 + local_f0 * l + iVar3 * l * m;
          i = iVar4;
          tri[2] = tri[0];
          tri[3] = j;
          hex[2] = j;
          hex[3] = tri[0];
          hex[4] = iVar4;
          hex[5] = iVar5;
          uVar2 = ref_cell_add(pRVar1->cell[3],&j,&local_bc);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                   ,0x62f,"ref_fixture_pri_brick_args_grid",(ulong)uVar2,"tri");
            return uVar2;
          }
          j = tri[3];
          i = iVar5;
          tri[0] = iVar4;
          uVar2 = ref_cell_add(pRVar1->cell[3],&j,&local_bc);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                   ,0x633,"ref_fixture_pri_brick_args_grid",(ulong)uVar2,"tri");
            return uVar2;
          }
        }
      }
      ref_grid_ptr_local._4_4_ = ref_node_initialize_n_global(ref_node_00,(long)(l * m * n));
      if (ref_grid_ptr_local._4_4_ == 0) {
        ref_grid_ptr_local._4_4_ = 0;
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
               0x636,"ref_fixture_pri_brick_args_grid",(ulong)ref_grid_ptr_local._4_4_,"init glob");
      }
    }
    else {
      ref_grid_ptr_local._4_4_ = ref_node_initialize_n_global(ref_node_00,(long)(l * m * n));
      if (ref_grid_ptr_local._4_4_ == 0) {
        ref_grid_ptr_local._4_4_ = 0;
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
               0x59c,"ref_fixture_pri_brick_args_grid",(ulong)ref_grid_ptr_local._4_4_,"init glob");
      }
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",0x597
           ,"ref_fixture_pri_brick_args_grid",(ulong)ref_grid_ptr_local._4_4_,"create");
  }
  return ref_grid_ptr_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_fixture_pri_brick_args_grid(
    REF_GRID *ref_grid_ptr, REF_MPI ref_mpi, REF_DBL x0, REF_DBL x1, REF_DBL y0,
    REF_DBL y1, REF_DBL z0, REF_DBL z1, REF_INT l, REF_INT m, REF_INT n,
    REF_INT l0) {
  REF_GRID ref_grid;
  REF_NODE ref_node;
  REF_INT global, node, hex[8], pri[6], cell;
  REF_INT quad[5], tri[4];

  REF_INT i, j, k;
  REF_DBL dx, dy, dz;

  l0 = MAX(0, l0);
  l0 = MIN(l0, l - 1);

  dx = (x1 - x0) / ((REF_DBL)(l - 1));
  dy = (y1 - y0) / ((REF_DBL)(m - 1));
  dz = (z1 - z0) / ((REF_DBL)(n - 1));

  RSS(ref_grid_create(ref_grid_ptr, ref_mpi), "create");
  ref_grid = *ref_grid_ptr;
  ref_node = ref_grid_node(ref_grid);

  if (!ref_mpi_once(ref_grid_mpi(ref_grid))) {
    RSS(ref_node_initialize_n_global(ref_node, l * m * n), "init glob");
    return REF_SUCCESS;
  }

#define ijk2node(i, j, k, l, m, n) ((i) + (j) * (l) + (k) * (l) * (m))

  for (k = 0; k < n; k++)
    for (j = 0; j < m; j++)
      for (i = 0; i < l; i++) {
        global = ijk2node(i, j, k, l, m, n);
        RSS(ref_node_add(ref_node, global, &node), "node");
        ref_node_xyz(ref_node, 0, node) = x0 + dx * (REF_DBL)i;
        ref_node_xyz(ref_node, 1, node) = y0 + dy * (REF_DBL)j;
        ref_node_xyz(ref_node, 2, node) = z0 + dz * (REF_DBL)k;
      }

#define ijk2hex(i, j, k, l, m, n, hex)                     \
  (hex)[0] = ijk2node((i)-1, (j)-1, (k)-1, (l), (m), (n)); \
  (hex)[1] = ijk2node((i), (j)-1, (k)-1, (l), (m), (n));   \
  (hex)[2] = ijk2node((i), (j), (k)-1, (l), (m), (n));     \
  (hex)[3] = ijk2node((i)-1, (j), (k)-1, (l), (m), (n));   \
  (hex)[4] = ijk2node((i)-1, (j)-1, (k), (l), (m), (n));   \
  (hex)[5] = ijk2node((i), (j)-1, (k), (l), (m), (n));     \
  (hex)[6] = ijk2node((i), (j), (k), (l), (m), (n));       \
  (hex)[7] = ijk2node((i)-1, (j), (k), (l), (m), (n));

  for (k = 1; k < n; k++)
    for (j = 1; j < m; j++)
      for (i = 1; i < l; i++) {
        ijk2hex(i, j, k, l, m, n, hex);
        pri[0] = hex[0];
        pri[1] = hex[1];
        pri[2] = hex[2];
        pri[3] = hex[4];
        pri[4] = hex[5];
        pri[5] = hex[6];
        RSS(ref_cell_add(ref_grid_pri(ref_grid), pri, &cell), "pri");
        pri[0] = hex[0];
        pri[1] = hex[2];
        pri[2] = hex[3];
        pri[3] = hex[4];
        pri[4] = hex[6];
        pri[5] = hex[7];
        RSS(ref_cell_add(ref_grid_pri(ref_grid), pri, &cell), "pri");
      }

  quad[4] = 1;
  i = 1;
  for (k = 1; k < n; k++)
    for (j = 1; j < m; j++) {
      ijk2hex(i, j, k, l, m, n, hex);
      quad[0] = hex[0];
      quad[1] = hex[3];
      quad[2] = hex[7];
      quad[3] = hex[4];
      RSS(ref_cell_add(ref_grid_qua(ref_grid), quad, &cell), "qua");
    }

  quad[4] = 2;
  i = l - 1;
  for (k = 1; k < n; k++)
    for (j = 1; j < m; j++) {
      ijk2hex(i, j, k, l, m, n, hex);
      quad[0] = hex[2];
      quad[1] = hex[1];
      quad[2] = hex[5];
      quad[3] = hex[6];
      RSS(ref_cell_add(ref_grid_qua(ref_grid), quad, &cell), "qua");
    }

  quad[4] = 3;
  j = 1;
  for (k = 1; k < n; k++)
    for (i = 1; i < l; i++) {
      ijk2hex(i, j, k, l, m, n, hex);
      quad[0] = hex[1];
      quad[1] = hex[0];
      quad[2] = hex[4];
      quad[3] = hex[5];
      RSS(ref_cell_add(ref_grid_qua(ref_grid), quad, &cell), "qua");
    }

  quad[4] = 4;
  j = m - 1;
  for (k = 1; k < n; k++)
    for (i = 1; i < l; i++) {
      ijk2hex(i, j, k, l, m, n, hex);
      quad[0] = hex[3];
      quad[1] = hex[2];
      quad[2] = hex[6];
      quad[3] = hex[7];
      RSS(ref_cell_add(ref_grid_qua(ref_grid), quad, &cell), "qua");
    }

  quad[4] = 7;
  tri[3] = quad[4];
  k = 1;
  for (j = 1; j < m; j++)
    for (i = 1; i < l0 + 1; i++) {
      ijk2hex(i, j, k, l, m, n, hex);
      quad[0] = hex[0];
      quad[1] = hex[1];
      quad[2] = hex[2];
      quad[3] = hex[3];
      tri[0] = quad[0];
      tri[1] = quad[1];
      tri[2] = quad[2];
      RSS(ref_cell_add(ref_grid_tri(ref_grid), tri, &cell), "tri");
      tri[0] = quad[0];
      tri[1] = quad[2];
      tri[2] = quad[3];
      RSS(ref_cell_add(ref_grid_tri(ref_grid), tri, &cell), "tri");
    }

  quad[4] = 5;
  tri[3] = quad[4];
  k = 1;
  for (j = 1; j < m; j++)
    for (i = l0 + 1; i < l; i++) {
      ijk2hex(i, j, k, l, m, n, hex);
      quad[0] = hex[0];
      quad[1] = hex[1];
      quad[2] = hex[2];
      quad[3] = hex[3];
      tri[0] = quad[0];
      tri[1] = quad[1];
      tri[2] = quad[2];
      RSS(ref_cell_add(ref_grid_tri(ref_grid), tri, &cell), "tri");
      tri[0] = quad[0];
      tri[1] = quad[2];
      tri[2] = quad[3];
      RSS(ref_cell_add(ref_grid_tri(ref_grid), tri, &cell), "tri");
    }

  quad[4] = 6;
  tri[3] = quad[4];
  k = n - 1;
  for (j = 1; j < m; j++)
    for (i = 1; i < l; i++) {
      ijk2hex(i, j, k, l, m, n, hex);
      quad[0] = hex[5];
      quad[1] = hex[4];
      quad[2] = hex[7];
      quad[3] = hex[6];
      tri[0] = quad[1];
      tri[1] = quad[3];
      tri[2] = quad[0];
      RSS(ref_cell_add(ref_grid_tri(ref_grid), tri, &cell), "tri");
      tri[0] = quad[1];
      tri[1] = quad[2];
      tri[2] = quad[3];
      RSS(ref_cell_add(ref_grid_tri(ref_grid), tri, &cell), "tri");
    }

  RSS(ref_node_initialize_n_global(ref_node, l * m * n), "init glob");

  return REF_SUCCESS;
}